

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestAllTypesLite::ByteSizeLong(TestAllTypesLite *this)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  size_t sVar32;
  size_t sVar33;
  size_t sVar34;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar35;
  Rep *pRVar36;
  ulong uVar37;
  int n;
  int n_1;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *pRVar38;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *pRVar39;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *pRVar40;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *pRVar41;
  long lVar42;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *this_03;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *this_04;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *this_05;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *pRVar43;
  
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  sVar29 = google::protobuf::internal::WireFormatLite::Int32Size(pRVar1);
  uVar8 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [824])((undefined1  [824])this->field_0 & (undefined1  [824])0x4)
                     == (undefined1  [824])0x0);
  pRVar2 = &(this->field_0)._impl_.repeated_int64_;
  sVar30 = google::protobuf::internal::WireFormatLite::Int64Size(pRVar2);
  uVar9 = google::protobuf::internal::SooRep::size
                    (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  pRVar3 = &(this->field_0)._impl_.repeated_uint32_;
  sVar31 = google::protobuf::internal::WireFormatLite::UInt32Size(pRVar3);
  uVar10 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  pRVar4 = &(this->field_0)._impl_.repeated_uint64_;
  sVar32 = google::protobuf::internal::WireFormatLite::UInt64Size(pRVar4);
  uVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x40) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.repeated_sint32_;
  sVar33 = google::protobuf::internal::WireFormatLite::SInt32Size(pRVar1);
  uVar12 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x50) & 4) == 0);
  pRVar2 = &(this->field_0)._impl_.repeated_sint64_;
  sVar34 = google::protobuf::internal::WireFormatLite::SInt64Size(pRVar2);
  uVar13 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x60) & 4) == 0);
  pRVar3 = &(this->field_0)._impl_.repeated_fixed32_;
  uVar14 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  uVar15 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  pRVar4 = &(this->field_0)._impl_.repeated_fixed64_;
  uVar16 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  uVar17 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed32_;
  uVar18 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  uVar19 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  pRVar2 = &(this->field_0)._impl_.repeated_sfixed64_;
  uVar20 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  uVar21 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  this_00 = &(this->field_0)._impl_.repeated_float_;
  uVar22 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  uVar23 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  this_01 = &(this->field_0)._impl_.repeated_double_;
  uVar24 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  uVar25 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  this_02 = &(this->field_0)._impl_.repeated_bool_;
  uVar26 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  uVar27 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  uVar28 = *(uint *)((long)&this->field_0 + 0xe8);
  lVar42 = sVar34 + sVar33 + sVar32 + sVar31 + sVar30 + sVar29 +
           ((ulong)uVar18 + (ulong)uVar14 + (ulong)uVar22) * 4 +
           ((ulong)uVar20 + (ulong)uVar16 + (ulong)uVar24) * 8 + (ulong)uVar26 +
           ((ulong)uVar27 + (ulong)uVar25 + (ulong)uVar28 +
           (ulong)uVar19 + (ulong)uVar17 + (ulong)uVar21 + (ulong)uVar23 +
           (ulong)uVar13 + (ulong)uVar12 + (ulong)uVar15 +
           (ulong)uVar11 + (ulong)uVar10 + (ulong)uVar9 + (ulong)uVar8) * 2;
  if (0 < (int)uVar28) {
    uVar8 = 0;
    do {
      pVVar35 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase,uVar8
                          );
      uVar9 = (uint)pVVar35->_M_string_length | 1;
      iVar6 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + pVVar35->_M_string_length + (ulong)(iVar6 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar28 != uVar8);
  }
  uVar28 = *(uint *)((long)&this->field_0 + 0x100);
  lVar42 = lVar42 + (ulong)uVar28 * 2;
  if (0 < (int)uVar28) {
    uVar8 = 0;
    do {
      pVVar35 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase,uVar8)
      ;
      uVar9 = (uint)pVVar35->_M_string_length | 1;
      iVar6 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + pVVar35->_M_string_length + (ulong)(iVar6 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar28 != uVar8);
  }
  iVar6 = *(int *)((long)&this->field_0 + 0x118);
  this_03 = &(this->field_0)._impl_.repeatedgroup_;
  pRVar38 = this_03;
  if ((*(byte *)((long)&this->field_0 + 0x110) & 1) != 0) {
    pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_03->super_RepeatedPtrFieldBase);
    pRVar38 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *)pRVar36->elements
    ;
    if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_03->super_RepeatedPtrFieldBase);
      this_03 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *)
                pRVar36->elements;
    }
  }
  lVar42 = lVar42 + (long)iVar6 * 4;
  iVar6 = *(int *)((long)&this->field_0 + 0x118);
  for (; pRVar38 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *)
         (&(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar6);
      pRVar38 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *)
                &(pRVar38->super_RepeatedPtrFieldBase).current_size_) {
    sVar29 = TestAllTypesLite_RepeatedGroup::ByteSizeLong
                       ((TestAllTypesLite_RepeatedGroup *)
                        (pRVar38->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    lVar42 = lVar42 + sVar29;
  }
  iVar6 = *(int *)((long)&this->field_0 + 0x130);
  pRVar43 = &(this->field_0)._impl_.repeated_nested_message_;
  pRVar41 = pRVar43;
  if ((*(byte *)((long)&this->field_0 + 0x128) & 1) != 0) {
    pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar43->super_RepeatedPtrFieldBase);
    pRVar41 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)pRVar36->elements
    ;
    if (((ulong)(pRVar43->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar43->super_RepeatedPtrFieldBase);
      pRVar43 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
                pRVar36->elements;
    }
  }
  lVar42 = lVar42 + (long)iVar6 * 2;
  iVar6 = *(int *)((long)&this->field_0 + 0x130);
  for (; pRVar41 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
         (&(pRVar43->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar6);
      pRVar41 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
                &(pRVar41->super_RepeatedPtrFieldBase).current_size_) {
    sVar29 = TestAllTypesLite_NestedMessage::ByteSizeLong
                       ((TestAllTypesLite_NestedMessage *)
                        (pRVar41->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar28 = (uint)sVar29 | 1;
    iVar7 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    lVar42 = lVar42 + sVar29 + (ulong)(iVar7 * 9 + 0x49U >> 6);
  }
  iVar6 = *(int *)((long)&this->field_0 + 0x148);
  this_04 = &(this->field_0)._impl_.repeated_foreign_message_;
  pRVar39 = this_04;
  if ((*(byte *)((long)&this->field_0 + 0x140) & 1) != 0) {
    pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_04->super_RepeatedPtrFieldBase);
    pRVar39 = (RepeatedPtrField<proto2_unittest::ForeignMessageLite> *)pRVar36->elements;
    if (((ulong)(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_04->super_RepeatedPtrFieldBase);
      this_04 = (RepeatedPtrField<proto2_unittest::ForeignMessageLite> *)pRVar36->elements;
    }
  }
  lVar42 = lVar42 + (long)iVar6 * 2;
  iVar6 = *(int *)((long)&this->field_0 + 0x148);
  for (; pRVar39 !=
         (RepeatedPtrField<proto2_unittest::ForeignMessageLite> *)
         (&(this_04->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar6);
      pRVar39 = (RepeatedPtrField<proto2_unittest::ForeignMessageLite> *)
                &(pRVar39->super_RepeatedPtrFieldBase).current_size_) {
    sVar29 = ForeignMessageLite::ByteSizeLong
                       ((ForeignMessageLite *)
                        (pRVar39->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar28 = (uint)sVar29 | 1;
    iVar7 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    lVar42 = lVar42 + sVar29 + (ulong)(iVar7 * 9 + 0x49U >> 6);
  }
  iVar6 = *(int *)((long)&this->field_0 + 0x160);
  this_05 = &(this->field_0)._impl_.repeated_import_message_;
  pRVar40 = this_05;
  if ((*(byte *)((long)&this->field_0 + 0x158) & 1) != 0) {
    pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_05->super_RepeatedPtrFieldBase);
    pRVar40 = (RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *)pRVar36->elements;
    if (((ulong)(this_05->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_05->super_RepeatedPtrFieldBase);
      this_05 = (RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *)pRVar36->elements;
    }
  }
  lVar42 = lVar42 + (long)iVar6 * 2;
  iVar6 = *(int *)((long)&this->field_0 + 0x160);
  for (; pRVar40 !=
         (RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *)
         (&(this_05->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar6);
      pRVar40 = (RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *)
                &(pRVar40->super_RepeatedPtrFieldBase).current_size_) {
    sVar29 = proto2_unittest_import::ImportMessageLite::ByteSizeLong
                       ((ImportMessageLite *)
                        (pRVar40->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar28 = (uint)sVar29 | 1;
    iVar7 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    lVar42 = lVar42 + sVar29 + (ulong)(iVar7 * 9 + 0x49U >> 6);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_nested_enum_;
  sVar29 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar8 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x170) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.repeated_foreign_enum_;
  sVar30 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar9 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x180) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.repeated_import_enum_;
  sVar31 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar10 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 400) & 4) == 0);
  uVar28 = *(uint *)((long)&this->field_0 + 0x1a8);
  lVar42 = sVar30 + sVar29 + sVar31 + lVar42 +
           ((ulong)uVar10 + (ulong)uVar28 + (ulong)uVar9 + (ulong)uVar8) * 2;
  if (0 < (int)uVar28) {
    uVar8 = 0;
    do {
      pVVar35 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase
                           ,uVar8);
      uVar9 = (uint)pVVar35->_M_string_length | 1;
      iVar6 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + pVVar35->_M_string_length + (ulong)(iVar6 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar28 != uVar8);
  }
  uVar28 = *(uint *)((long)&this->field_0 + 0x1c0);
  lVar42 = lVar42 + (ulong)uVar28 * 2;
  if (0 < (int)uVar28) {
    uVar8 = 0;
    do {
      pVVar35 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase,uVar8);
      uVar9 = (uint)pVVar35->_M_string_length | 1;
      iVar6 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + pVVar35->_M_string_length + (ulong)(iVar6 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar28 != uVar8);
  }
  iVar6 = *(int *)((long)&this->field_0 + 0x1d8);
  pRVar43 = &(this->field_0)._impl_.repeated_lazy_message_;
  pRVar41 = pRVar43;
  if ((*(byte *)((long)&this->field_0 + 0x1d0) & 1) != 0) {
    pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar43->super_RepeatedPtrFieldBase);
    pRVar41 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)pRVar36->elements
    ;
    if (((ulong)(pRVar43->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar36 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar43->super_RepeatedPtrFieldBase);
      pRVar43 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
                pRVar36->elements;
    }
  }
  lVar42 = lVar42 + (long)iVar6 * 2;
  iVar6 = *(int *)((long)&this->field_0 + 0x1d8);
  for (; pRVar41 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
         (&(pRVar43->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar6);
      pRVar41 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
                &(pRVar41->super_RepeatedPtrFieldBase).current_size_) {
    sVar29 = TestAllTypesLite_NestedMessage::ByteSizeLong
                       ((TestAllTypesLite_NestedMessage *)
                        (pRVar41->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar28 = (uint)sVar29 | 1;
    iVar7 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    lVar42 = lVar42 + sVar29 + (ulong)(iVar7 * 9 + 0x49U >> 6);
  }
  uVar28 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  lVar42 = (ulong)(uVar28 >> 0x16 & 2) + lVar42 +
           (ulong)((((uVar28 >> 0x12 & 0x13) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) *
                  9) +
           (ulong)((((uVar28 >> 0x11 & 0x19) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) *
                  5);
  if ((char)uVar28 != '\0') {
    if ((uVar28 & 1) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar28 & 2) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar28 & 4) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_piece_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 8) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 0x10) != 0) {
      sVar29 = TestAllTypesLite_OptionalGroup::ByteSizeLong((this->field_0)._impl_.optionalgroup_);
      lVar42 = lVar42 + sVar29 + 4;
    }
    if ((uVar28 & 0x20) != 0) {
      sVar29 = TestAllTypesLite_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_nested_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 0x40) != 0) {
      sVar29 = ForeignMessageLite::ByteSizeLong((this->field_0)._impl_.optional_foreign_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar28 < '\0') {
      sVar29 = proto2_unittest_import::ImportMessageLite::ByteSizeLong
                         ((this->field_0)._impl_.optional_import_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar28 & 0xff00) != 0) {
    if ((uVar28 >> 8 & 1) != 0) {
      sVar29 = proto2_unittest_import::PublicImportMessageLite::ByteSizeLong
                         ((this->field_0)._impl_.optional_public_import_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 9 & 1) != 0) {
      sVar29 = TestAllTypesLite_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_lazy_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 10 & 1) != 0) {
      sVar29 = TestAllTypesLite_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_unverified_lazy_message_);
      uVar8 = (uint)sVar29 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + sVar29 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0xb & 1) != 0) {
      uVar37 = (this->field_0)._impl_.optional_int64_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x89U >> 6);
    }
    if ((uVar28 >> 0xc & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x89U >> 6);
    }
    if ((uVar28 >> 0xd & 1) != 0) {
      uVar8 = (this->field_0)._impl_.optional_uint32_ | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)(iVar6 * 9 + 0x89U >> 6);
    }
    if ((uVar28 >> 0xe & 1) != 0) {
      uVar37 = (this->field_0)._impl_.optional_uint64_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x89U >> 6);
    }
    if ((short)uVar28 < 0) {
      lVar5 = (this->field_0)._impl_.optional_sint64_;
      uVar37 = lVar5 >> 0x3f ^ lVar5 * 2 | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar28 >> 0x10 & 1) != 0) {
    iVar6 = (this->field_0)._impl_.optional_sint32_;
    uVar8 = iVar6 >> 0x1f ^ iVar6 * 2 | 1;
    iVar6 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    lVar42 = lVar42 + (ulong)(iVar6 * 9 + 0x89U >> 6);
  }
  if (0xffffff < uVar28) {
    if ((uVar28 >> 0x18 & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.optional_import_enum_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x19 & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.optional_nested_enum_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x1a & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.optional_foreign_enum_ | 1;
      lVar5 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      lVar42 = lVar42 + (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x1b & 1) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.default_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x1c & 1) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.default_bytes_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x1d & 1) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.default_string_piece_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 >> 0x1e & 1) != 0) {
      lVar5 = *(long *)(((ulong)(this->field_0)._impl_.default_cord_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar5 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + lVar5 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((int)uVar28 < 0) {
      uVar37 = (ulong)*(char *)((long)&this->field_0 + 0x2b8);
      if ((uVar37 & 1) == 0) {
        uVar37 = uVar37 >> 1;
      }
      else {
        uVar37 = **(ulong **)((long)&this->field_0 + 0x2c0);
      }
      uVar28 = (uint)uVar37 | 1;
      iVar6 = 0x1f;
      if (uVar28 != 0) {
        for (; uVar28 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      lVar42 = lVar42 + uVar37 + (ulong)(iVar6 * 9 + 0x49U >> 6) + 2;
    }
  }
  uVar28 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  sVar29 = (ulong)(uVar28 >> 0xd & 1) * 3 +
           (ulong)((((uVar28 >> 8 & 0x13) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1b &
                   0xfffffffe) * 5) + lVar42 +
           (ulong)((((uVar28 >> 7 & 0x19) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1b &
                   0xfffffffe) * 3);
  if ((uVar28 & 0x7f) != 0) {
    if ((uVar28 & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.deceptively_named_list_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 2) != 0) {
      uVar37 = (this->field_0)._impl_.default_int64_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 4) != 0) {
      uVar37 = (long)(this->field_0)._impl_.default_int32_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 8) != 0) {
      uVar8 = (this->field_0)._impl_.default_uint32_ | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      sVar29 = sVar29 + (iVar6 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 0x10) != 0) {
      uVar37 = (this->field_0)._impl_.default_uint64_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 0x20) != 0) {
      lVar42 = (this->field_0)._impl_.default_sint64_;
      uVar37 = lVar42 >> 0x3f ^ lVar42 * 2 | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar28 & 0x40) != 0) {
      iVar6 = (this->field_0)._impl_.default_sint32_;
      uVar8 = iVar6 >> 0x1f ^ iVar6 * 2 | 1;
      iVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      sVar29 = sVar29 + (iVar6 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar28 & 0xc000) != 0) {
    if ((uVar28 >> 0xe & 1) != 0) {
      uVar37 = (long)(this->field_0)._impl_.default_nested_enum_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
    if ((short)uVar28 < 0) {
      uVar37 = (long)(this->field_0)._impl_.default_foreign_enum_ | 1;
      lVar42 = 0x3f;
      if (uVar37 != 0) {
        for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
        }
      }
      sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar28 >> 0x10 & 1) != 0) {
    uVar37 = (long)(this->field_0)._impl_.default_import_enum_ | 1;
    lVar42 = 0x3f;
    if (uVar37 != 0) {
      for (; uVar37 >> lVar42 == 0; lVar42 = lVar42 + -1) {
      }
    }
    sVar29 = sVar29 + ((int)lVar42 * 9 + 0x49U >> 6) + 2;
  }
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x6f:
    uVar37 = (ulong)*(uint *)((long)&this->field_0 + 0x328);
    goto LAB_001c70ed;
  case 0x70:
  case 0x73:
  case 0x75:
    uVar37 = (**(code **)(**(long **)((long)&this->field_0 + 0x328) + 0x18))();
    break;
  case 0x71:
  case 0x72:
    uVar37 = *(ulong *)(((ulong)(this->field_0)._impl_.oneof_field_.oneof_nested_message_ &
                        0xfffffffffffffffc) + 8);
    break;
  default:
    goto switchD_001c70ca_caseD_74;
  }
  sVar29 = sVar29 + uVar37;
LAB_001c70ed:
  uVar28 = (uint)uVar37 | 1;
  iVar6 = 0x1f;
  if (uVar28 != 0) {
    for (; uVar28 >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
  }
  sVar29 = sVar29 + (iVar6 * 9 + 0x49U >> 6) + 2;
switchD_001c70ca_caseD_74:
  uVar37 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar37 & 1) != 0) {
    sVar29 = sVar29 + *(long *)((uVar37 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar29 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar29;
  }
  return sVar29;
}

Assistant:

::size_t TestAllTypesLite::ByteSizeLong() const {
  const TestAllTypesLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAllTypesLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int64 repeated_int64 = 32;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int64Size(
          this_._internal_repeated_int64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_int64_size());
      total_size += tag_size + data_size;
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt32Size(
          this_._internal_repeated_uint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint32_size());
      total_size += tag_size + data_size;
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt64Size(
          this_._internal_repeated_uint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint64_size());
      total_size += tag_size + data_size;
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt32Size(
          this_._internal_repeated_sint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint32_size());
      total_size += tag_size + data_size;
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt64Size(
          this_._internal_repeated_sint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint64_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.RepeatedGroup repeatedgroup = 46 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.ForeignMessageLite repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest_import.ImportMessageLite repeated_import_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_import_message_size();
      for (const auto& msg : this_._internal_repeated_import_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedEnum repeated_nested_enum = 51;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_nested_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_nested_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest.ForeignEnumLite repeated_foreign_enum = 52;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_foreign_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_foreign_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest_import.ImportEnumLite repeated_import_enum = 53;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_import_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_import_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x004c0000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x00320000u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00800000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_piece());
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // .proto2_unittest.TestAllTypesLite.OptionalGroup optionalgroup = 16 [features = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 4 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .proto2_unittest.ForeignMessageLite optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest_import.ImportMessageLite optional_import_message = 20;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_import_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // .proto2_unittest_import.PublicImportMessageLite optional_public_import_message = 26;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_public_import_message_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_lazy_message = 27 [lazy = true];
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_unverified_lazy_message = 28 [unverified_lazy = true];
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_unverified_lazy_message_);
    }
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
  }
   {
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // .proto2_unittest_import.ImportEnumLite optional_import_enum = 23;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_import_enum());
    }
    // .proto2_unittest.TestAllTypesLite.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // .proto2_unittest.ForeignEnumLite optional_foreign_enum = 22;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
    }
    // string default_string = 74 [default = "hello"];
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string());
    }
    // bytes default_bytes = 75 [default = "world"];
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_default_bytes());
    }
    // string default_string_piece = 84 [default = "abc", ctype = STRING_PIECE];
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string_piece());
    }
    // string default_cord = 85 [default = "123", ctype = CORD];
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_cord());
    }
    // bytes optional_bytes_cord = 86 [ctype = CORD];
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this_._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  total_size += ::absl::popcount(0x00001300u & cached_has_bits) * 10;
  total_size += ::absl::popcount(0x00000c80u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00002000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // int32 deceptively_named_list = 116;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_deceptively_named_list());
    }
    // int64 default_int64 = 62 [default = 42];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_default_int64());
    }
    // int32 default_int32 = 61 [default = 41];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_default_int32());
    }
    // uint32 default_uint32 = 63 [default = 43];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_default_uint32());
    }
    // uint64 default_uint64 = 64 [default = 44];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_default_uint64());
    }
    // sint64 default_sint64 = 66 [default = 46];
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt64Size(
                                      this_._internal_default_sint64());
    }
    // sint32 default_sint32 = 65 [default = -45];
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt32Size(
                                      this_._internal_default_sint32());
    }
  }
  if ((cached_has_bits & 0x0000c000u) != 0) {
    // .proto2_unittest.TestAllTypesLite.NestedEnum default_nested_enum = 81 [default = BAR];
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_nested_enum());
    }
    // .proto2_unittest.ForeignEnumLite default_foreign_enum = 82 [default = FOREIGN_LITE_BAR];
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_foreign_enum());
    }
  }
   {
    // .proto2_unittest_import.ImportEnumLite default_import_enum = 83 [default = IMPORT_LITE_BAR];
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_import_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 114;
    case kOneofBytes: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage oneof_lazy_nested_message = 115 [lazy = true];
    case kOneofLazyNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_lazy_nested_message_);
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage2 oneof_nested_message2 = 117;
    case kOneofNestedMessage2: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message2_);
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}